

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

string * __thiscall
flatbuffers::lobster::LobsterGenerator::NamespacedName_abi_cxx11_
          (string *__return_storage_ptr__,LobsterGenerator *this,Definition *def)

{
  Namespace *ns;
  string local_40;
  
  ns = def->defined_namespace;
  EscapeKeyword(&local_40,this,&def->name);
  BaseGenerator::WrapInNameSpace(__return_storage_ptr__,&this->super_BaseGenerator,ns,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string NamespacedName(const Definition &def) {
    return WrapInNameSpace(def.defined_namespace, NormalizedName(def));
  }